

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void train(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  byte bVar1;
  ofstream ofs;
  Args *in_stack_00000128;
  FastText *in_stack_00000130;
  string outputFileName;
  FastText fasttext;
  Args a;
  Args *in_stack_fffffffffffffb70;
  invalid_argument *this;
  char *in_stack_fffffffffffffb90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb98;
  Args *in_stack_fffffffffffffbb0;
  FastText *in_stack_fffffffffffffbc0;
  string local_428 [32];
  undefined1 local_408 [448];
  string *in_stack_fffffffffffffdb8;
  FastText *in_stack_fffffffffffffdc0;
  string local_208 [64];
  string *in_stack_fffffffffffffe38;
  FastText *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  FastText *in_stack_fffffffffffffe50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe88;
  Args *in_stack_fffffffffffffe90;
  byte local_20;
  
  ::fasttext::Args::Args(in_stack_fffffffffffffbb0);
  ::fasttext::Args::parseArgs(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  ::fasttext::FastText::FastText(in_stack_fffffffffffffbc0);
  std::operator+(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  std::ofstream::ofstream(local_408,local_208,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    std::invalid_argument::invalid_argument(this,local_428);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::ofstream::close();
  ::fasttext::FastText::train(in_stack_00000130,in_stack_00000128);
  ::fasttext::FastText::saveModel(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::operator+(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  ::fasttext::FastText::saveVectors(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbb0);
  if ((local_20 & 1) != 0) {
    std::operator+(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    ::fasttext::FastText::saveOutput(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffb90);
  }
  std::ofstream::~ofstream(local_408);
  std::__cxx11::string::~string(local_208);
  ::fasttext::FastText::~FastText((FastText *)in_stack_fffffffffffffb70);
  ::fasttext::Args::~Args(in_stack_fffffffffffffb70);
  return;
}

Assistant:

void train(const std::vector<std::string> args) {
  Args a = Args();
  a.parseArgs(args);
  FastText fasttext;
  std::string outputFileName(a.output + ".bin");
  std::ofstream ofs(outputFileName);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        outputFileName + " cannot be opened for saving.");
  }
  ofs.close();
  fasttext.train(a);
  fasttext.saveModel(outputFileName);
  fasttext.saveVectors(a.output + ".vec");
  if (a.saveOutput) {
    fasttext.saveOutput(a.output + ".output");
  }
}